

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O0

result_type_conflict1 __thiscall
iutest::detail::iuTypedRandom<int>::genrand(iuTypedRandom<int> *this)

{
  int iVar1;
  iuTypedRandom<int> *this_local;
  
  iVar1 = iuRandom::genrand<int>(&this->m_rnd);
  return iVar1;
}

Assistant:

result_type genrand()
    {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
#if defined(__MWERKS__)
        return m_rnd.template genrand<result_type>();
#else
        return m_rnd.genrand<result_type>();
#endif
#else
        return m_rnd.genrand(detail::explicit_type<result_type>());
#endif
    }